

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Voice::Voice(Voice *this)

{
  _func_int **pp_Var1;
  Element *in_RDI;
  Element *in_stack_ffffffffffffffe0;
  
  Element::Element(in_RDI);
  in_RDI->_vptr_Element = (_func_int **)&PTR__Voice_00115a10;
  Element::set_random_pos(in_stack_ffffffffffffffe0);
  pp_Var1 = (_func_int **)al_create_voice(0xac44,1,0x20);
  in_RDI[1]._vptr_Element = pp_Var1;
  return;
}

Assistant:

Voice::Voice()
{
   set_random_pos();
   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
      ALLEGRO_CHANNEL_CONF_2);
}